

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O1

void __thiscall ANN::print(ANN *this,LayerType type)

{
  pointer pcVar1;
  double dVar2;
  uint uVar3;
  Perceptron *pPVar4;
  string *psVar5;
  ostream *poVar6;
  uint index;
  char cStack_d9;
  undefined1 auStack_d8 [48];
  _Alloc_hider _Stack_a8;
  char acStack_98 [24];
  Perceptron PStack_80;
  
  if (type == OutputLayer) {
    print(this,(int)((ulong)((long)(this->m_layers).
                                   super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d - 1
         );
    return;
  }
  Perceptron::Perceptron(&PStack_80);
  index = 0;
  while( true ) {
    uVar3 = Layer::get_nb_perceptrons
                      ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (uVar3 <= index) break;
    pPVar4 = Layer::get_perceptron
                       ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                        super__Vector_impl_data._M_start,index);
    auStack_d8._0_8_ = pPVar4->m_in;
    auStack_d8._8_8_ = pPVar4->m_out;
    std::function<double_(double)>::function
              ((function<double_(double)> *)(auStack_d8 + 0x10),&pPVar4->m_activation);
    _Stack_a8._M_p = acStack_98;
    pcVar1 = (pPVar4->m_label)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_a8,pcVar1,pcVar1 + (pPVar4->m_label)._M_string_length);
    psVar5 = Layer::label_abi_cxx11_
                       ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                        super__Vector_impl_data._M_start,index);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    dVar2 = Perceptron::get_output((Perceptron *)auStack_d8);
    poVar6 = std::ostream::_M_insert<double>(dVar2);
    cStack_d9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,&cStack_d9,1);
    Perceptron::~Perceptron((Perceptron *)auStack_d8);
    index = index + 1;
  }
  Perceptron::~Perceptron(&PStack_80);
  return;
}

Assistant:

void ANN::print(LayerType type) const{
    uint index;
    switch (type)
    {
    case InputLayer:
        index=0;
        break;
    case OutputLayer:
        index=m_layers.size()-1;
        break;
    default: break;
    }
    print(index);
}